

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

confirm * lest::for_test<lest::confirm>(tests *specification,texts *in,confirm *perform,int n)

{
  bool bVar1;
  uint uVar2;
  iterator this;
  reference testing_00;
  int in_ECX;
  fd_set *__exceptfds;
  confirm *in_RDX;
  fd_set *__writefds;
  timeval *in_R8;
  test *testing;
  iterator pos;
  int i;
  test *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  byte in_stack_ffffffffffffff17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  string local_68 [32];
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_> local_30;
  int local_28;
  int local_24;
  confirm *local_20;
  
  local_28 = 0;
  local_24 = in_ECX;
  local_20 = in_RDX;
  do {
    uVar2 = indefinite(local_24);
    __exceptfds = (fd_set *)(ulong)uVar2;
    if (uVar2 == 0 && local_24 <= local_28) {
      return local_20;
    }
    local_30._M_current =
         (test *)std::vector<lest::test,_std::allocator<lest::test>_>::begin
                           (in_stack_ffffffffffffff08);
    while( true ) {
      this = std::vector<lest::test,_std::allocator<lest::test>_>::end(in_stack_ffffffffffffff08);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                         (__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                          *)in_stack_ffffffffffffff08);
      if (!bVar1) break;
      testing_00 = __gnu_cxx::
                   __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                   ::operator*(&local_30);
      std::__cxx11::string::string(local_68,(string *)testing_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      uVar2 = select((int)local_68,(fd_set *)&stack0xffffffffffffff80,__writefds,__exceptfds,in_R8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_ffffffffffffff20);
      std::__cxx11::string::~string(local_68);
      if ((uVar2 & 1) != 0) {
        in_stack_ffffffffffffff20 = &local_b8;
        test::test((test *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
        confirm::operator()((confirm *)this._M_current,testing_00);
        in_stack_ffffffffffffff17 = abort<lest::confirm>((confirm *)0x1092e3);
        test::~test((test *)0x1092f3);
        if ((in_stack_ffffffffffffff17 & 1) != 0) {
          return local_20;
        }
      }
      __gnu_cxx::
      __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>::
      operator++(&local_30);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}